

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::stability(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  type_conflict5 tVar1;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  longlong i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u;
  
  iVar2 = (*(this->
            super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SLinSolver[1])(this);
  if (iVar2 == 0) {
    v = &(this->
         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).maxabs;
    u = &(this->
         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).initMaxabs;
    tVar1 = boost::multiprecision::operator<(v,u);
    if (!tVar1) {
      (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
      (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
      (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x10] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x11] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x12] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x13] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x14] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x15] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x16] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x17] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x18] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x19] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x1a] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[0x1b] = 0;
      *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&__return_storage_ptr__->m_backend,&u->m_backend,&v->m_backend);
      return __return_storage_ptr__;
    }
    i = 1;
  }
  else {
    i = 0;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&__return_storage_ptr__->m_backend,i,(type *)0x0);
  return __return_storage_ptr__;
}

Assistant:

R SLUFactor<R>::stability() const
{
   if(status() != this->OK)
      return 0;

   if(this->maxabs < this->initMaxabs)
      return 1;

   assert(this->maxabs != 0.0);
   return this->initMaxabs / this->maxabs;
}